

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void find_repeat_new_proc(Am_Object *cmd,Am_Value *new_sel,Am_Value *new_value)

{
  bool bVar1;
  Am_Which_Search_Direction dir_00;
  Am_Value *pAVar2;
  undefined1 local_68 [4];
  Am_Which_Search_Direction dir;
  undefined1 local_58 [8];
  Am_Value_List slots_and_values_used;
  undefined1 local_38 [8];
  Am_Value_List old_sel_list;
  Am_Object sel_widget;
  Am_Value *new_value_local;
  Am_Value *new_sel_local;
  Am_Object *cmd_local;
  
  pAVar2 = Am_Object::Get(cmd,0x197,0);
  Am_Object::Am_Object((Am_Object *)&old_sel_list.item,pAVar2);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_38);
  bVar1 = Am_Value::Exists(new_sel);
  if ((bVar1) && (bVar1 = Am_Value_List::Test(new_sel), bVar1)) {
    Am_Value_List::operator=((Am_Value_List *)local_38,new_sel);
  }
  else {
    pAVar2 = Am_Object::Get((Am_Object *)&old_sel_list.item,0x169,0);
    Am_Value_List::operator=((Am_Value_List *)local_38,pAVar2);
  }
  Am_Value::Am_Value((Am_Value *)local_68,new_sel);
  get_new_slots_and_values((Am_Object *)local_58,(Am_Value *)cmd,new_value);
  Am_Value::~Am_Value((Am_Value *)local_68);
  pAVar2 = Am_Object::Get(cmd,0xef,0);
  dir_00 = Am_Value::operator_cast_to_int(pAVar2);
  internal_search_using
            (cmd,dir_00,(Am_Object *)&old_sel_list.item,(Am_Value_List *)local_38,
             (Am_Value_List *)local_58);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_58);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_38);
  Am_Object::~Am_Object((Am_Object *)&old_sel_list.item);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void, find_repeat_new,
                 (Am_Object cmd, Am_Value new_sel, Am_Value new_value))
{
  Am_Object sel_widget = cmd.Get(Am_SELECTION_WIDGET);
  Am_Value_List old_sel_list;
  if (new_sel.Exists() && Am_Value_List::Test(new_sel))
    old_sel_list = new_sel;
  else
    old_sel_list = sel_widget.Get(Am_VALUE);
  Am_Value_List slots_and_values_used =
      get_new_slots_and_values(cmd, new_value, new_sel);
  Am_Which_Search_Direction dir =
      (Am_Which_Search_Direction)(int)cmd.Get(Am_CURRENT_DIRECTION);
  internal_search_using(cmd, dir, sel_widget, old_sel_list,
                        slots_and_values_used);
}